

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O0

char * google::protobuf::internal::TcParser::MpRepeatedMessageOrGroup<true,false>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  ParseContext *pPVar1;
  uint16_t type_card_00;
  TcParseTableBase *pTVar2;
  FieldEntry *pFVar3;
  ParseContext *p;
  MessageLite *x;
  bool bVar4;
  unsigned_short uVar5;
  uint32_t uVar6;
  int v1;
  int v2;
  uint uVar7;
  char *pcVar8;
  LogMessage *pLVar9;
  FieldAux *pFVar10;
  uint *puVar11;
  ulong uVar12;
  TailCallParseFunc UNRECOVERED_JUMPTABLE;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_308 [2];
  TcFieldData local_2f8 [2];
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_2e8;
  TcParseTableBase ***local_2e0;
  anon_class_24_3_0d95dd66 inner_loop;
  MessageLite *value;
  ParseContext *pPStack_2b8;
  uint32_t next_tag;
  char *ptr2;
  ParseContext *local_2a8;
  TcParseTableBase *inner_table;
  RepeatedPtrFieldBase *field;
  void *base;
  LogMessage local_288;
  Voidify local_277;
  unsigned_short local_276;
  int local_274;
  Nullable<const_char_*> local_270;
  Nullable<const_char_*> absl_log_internal_check_op_result_1;
  uint32_t decoded_wiretype;
  uint32_t decoded_tag;
  Voidify local_24f;
  unsigned_short local_24e;
  int local_24c;
  Nullable<const_char_*> local_248;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  FieldEntry *pFStack_238;
  uint16_t type_card;
  FieldEntry *entry;
  uint64_t hasbits_local;
  TcParseTableBase *table_local;
  ParseContext *ctx_local;
  char *ptr_local;
  MessageLite *msg_local;
  TcFieldData data_local;
  TcFieldData local_1f8;
  TcFieldData local_1f0;
  undefined1 local_1e1;
  FieldEntry *pFStack_1e0;
  bool always_return;
  TcParseTableBase *local_1d8;
  ParseContext *local_1d0;
  ParseContext *local_1c8;
  MessageLite *local_1c0;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_1b8;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_1b0;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_1a8;
  TcFieldData data_1;
  FastFieldEntry *fast_entry;
  size_t idx;
  unsigned_short coded_tag;
  uint32_t has_bits_offset;
  uint32_t has_bits_offset_1;
  LimitToken local_b4;
  LogMessage local_b0;
  Voidify local_99;
  Nullable<const_char_*> local_98;
  Nullable<const_char_*> absl_log_internal_check_op_result_2;
  undefined4 local_88;
  int old_depth;
  LimitToken local_74;
  TcParseTableBase ****ppppTStack_70;
  LimitToken old;
  ParseContext *local_58;
  undefined1 local_40 [12];
  int size;
  ParseContext *local_30;
  TcParseTableBase *local_28;
  ParseContext *local_20;
  ParseContext *local_18;
  TcParseTableBase ****local_10;
  
  entry = (FieldEntry *)hasbits;
  hasbits_local = (uint64_t)table;
  table_local = (TcParseTableBase *)ctx;
  ctx_local = (ParseContext *)ptr;
  ptr_local = (char *)msg;
  msg_local = (MessageLite *)data.field_0;
  uVar6 = TcFieldData::entry_offset((TcFieldData *)&msg_local);
  pFStack_238 = RefAt<google::protobuf::internal::TcParseTableBase::FieldEntry>(table,(ulong)uVar6);
  absl_log_internal_check_op_result._6_2_ = pFStack_238->type_card;
  local_24c = absl::lts_20250127::log_internal::GetReferenceableValue
                        (absl_log_internal_check_op_result._6_2_ & 0x30);
  local_24e = absl::lts_20250127::log_internal::GetReferenceableValue(0x20);
  local_248 = absl::lts_20250127::log_internal::Check_EQImpl<int,unsigned_short>
                        (&local_24c,&local_24e,
                         "type_card & field_layout::kFcMask == static_cast<uint16_t>(field_layout::kFcRepeated)"
                        );
  if (local_248 != (Nullable<const_char_*>)0x0) {
    pcVar8 = absl::lts_20250127::implicit_cast<char_const*>(local_248);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&decoded_wiretype,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
               ,0xa18,pcVar8);
    pLVar9 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                       ((LogMessage *)&decoded_wiretype);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_24f,pLVar9);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&decoded_wiretype);
  }
  absl_log_internal_check_op_result_1._4_4_ = TcFieldData::tag((TcFieldData *)&msg_local);
  absl_log_internal_check_op_result_1._0_4_ = absl_log_internal_check_op_result_1._4_4_ & 7;
  local_274 = absl::lts_20250127::log_internal::GetReferenceableValue
                        (absl_log_internal_check_op_result._6_2_ & 0x1c0);
  local_276 = absl::lts_20250127::log_internal::GetReferenceableValue(0);
  local_270 = absl::lts_20250127::log_internal::Check_EQImpl<int,unsigned_short>
                        (&local_274,&local_276,
                         "type_card & field_layout::kRepMask == static_cast<uint16_t>(field_layout::kRepMessage)"
                        );
  if (local_270 != (Nullable<const_char_*>)0x0) {
    pcVar8 = absl::lts_20250127::implicit_cast<char_const*>(local_270);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_288,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
               ,0xa1f,pcVar8);
    pLVar9 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_288);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_277,pLVar9);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_288);
  }
  if ((uint)absl_log_internal_check_op_result_1 != 2) {
    base = msg_local;
    pcVar8 = (char *)(**(code **)(hasbits_local + 0x30))
                               (ptr_local,ctx_local,table_local,msg_local,hasbits_local,entry);
    return pcVar8;
  }
  field = (RepeatedPtrFieldBase *)
          MaybeGetSplitBase((MessageLite *)ptr_local,true,(TcParseTableBase *)hasbits_local);
  inner_table = (TcParseTableBase *)
                MaybeCreateRepeatedRefAt<google::protobuf::internal::RepeatedPtrFieldBase,true>
                          (field,(ulong)pFStack_238->offset,(MessageLite *)ptr_local);
  type_card_00 = absl_log_internal_check_op_result._6_2_;
  pFVar10 = TcParseTableBase::field_aux((TcParseTableBase *)hasbits_local,pFStack_238);
  ptr2 = *(char **)pFVar10;
  local_2a8 = (ParseContext *)GetTableFromAux(type_card_00,(FieldAux)ptr2);
  pPStack_2b8 = ctx_local;
  while( true ) {
    inner_loop.inner_table =
         (TcParseTableBase **)
         AddMessage((TcParseTableBase *)local_2a8,(RepeatedPtrFieldBase *)inner_table);
    pTVar2 = table_local;
    pPVar1 = pPStack_2b8;
    local_2e0 = &inner_loop.inner_table;
    inner_loop.value = (MessageLite **)&table_local;
    inner_loop.ctx = &local_2a8;
    ppppTStack_70 = &local_2e0;
    EpsCopyInputStream::LimitToken::LimitToken(&local_74);
    local_28 = pTVar2;
    local_30 = pPVar1;
    unique0x10000741 = &local_74;
    local_40._4_4_ = ReadSize((char **)&local_30);
    if ((local_30 == (ParseContext *)0x0) || (*(int *)&pTVar2[1].class_data < 1)) {
      local_20 = (ParseContext *)0x0;
    }
    else {
      EpsCopyInputStream::PushLimit((EpsCopyInputStream *)local_40,(char *)pTVar2,(int)local_30);
      EpsCopyInputStream::LimitToken::operator=(stack0xffffffffffffffc8,(LimitToken *)local_40);
      EpsCopyInputStream::LimitToken::~LimitToken((LimitToken *)local_40);
      *(int *)&pTVar2[1].class_data = *(int *)&pTVar2[1].class_data + -1;
      local_20 = local_30;
    }
    if (local_20 == (ParseContext *)0x0) {
      local_58 = local_20;
    }
    else {
      absl_log_internal_check_op_result_2._4_4_ = *(int *)&pTVar2[1].class_data;
      local_10 = ppppTStack_70;
      local_18 = local_20;
      local_58 = (ParseContext *)
                 ParseLoopPreserveNone
                           ((MessageLite *)**ppppTStack_70,(char *)local_20,
                            (ParseContext *)*ppppTStack_70[1],(TcParseTableBase *)*ppppTStack_70[2])
      ;
      if (local_58 != (ParseContext *)0x0) {
        v1 = absl::lts_20250127::log_internal::GetReferenceableValue
                       (absl_log_internal_check_op_result_2._4_4_);
        v2 = absl::lts_20250127::log_internal::GetReferenceableValue(*(int *)&pTVar2[1].class_data);
        local_98 = absl::lts_20250127::log_internal::Check_EQImpl(v1,v2,"old_depth == depth_");
        if (local_98 != (Nullable<const_char_*>)0x0) {
          pcVar8 = absl::lts_20250127::implicit_cast<char_const*>(local_98);
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_b0,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
                     ,0x481,pcVar8);
          pLVar9 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_b0);
          absl::lts_20250127::log_internal::Voidify::operator&&(&local_99,pLVar9);
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&local_b0);
        }
        local_98 = (Nullable<const_char_*>)0x0;
      }
      *(int *)&pTVar2[1].class_data = *(int *)&pTVar2[1].class_data + 1;
      EpsCopyInputStream::LimitToken::LimitToken(&local_b4,&local_74);
      bVar4 = EpsCopyInputStream::PopLimit((EpsCopyInputStream *)pTVar2,&local_b4);
      EpsCopyInputStream::LimitToken::~LimitToken(&local_b4);
      if (((bVar4 ^ 0xffU) & 1) != 0) {
        local_58 = (ParseContext *)0x0;
      }
    }
    local_88 = 1;
    EpsCopyInputStream::LimitToken::~LimitToken(&local_74);
    ctx_local = local_58;
    if (local_58 == (ParseContext *)0x0) break;
    bVar4 = EpsCopyInputStream::DataAvailable((EpsCopyInputStream *)table_local,(char *)local_58);
    pcVar8 = ptr_local;
    pPVar1 = ctx_local;
    if (((bVar4 ^ 0xffU) & 1) != 0) {
      TcFieldData::TcFieldData(local_2f8);
      if (*(ushort *)hasbits_local != 0) {
        uVar7 = (uint)entry;
        puVar11 = RefAt<unsigned_int>(pcVar8,(ulong)(uint)*(ushort *)hasbits_local);
        *puVar11 = uVar7 | *puVar11;
      }
      return (char *)pPVar1;
    }
    pPStack_2b8 = (ParseContext *)ReadTag((char *)ctx_local,(uint32_t *)((long)&value + 4),0);
    pcVar8 = ptr_local;
    pPVar1 = ctx_local;
    pTVar2 = table_local;
    if (pPStack_2b8 == (ParseContext *)0x0) break;
    if (value._4_4_ != absl_log_internal_check_op_result_1._4_4_) {
      TcFieldData::TcFieldData((TcFieldData *)&local_2e8);
      local_1b8 = local_2e8;
      local_1c0 = (MessageLite *)pcVar8;
      local_1c8 = pPVar1;
      local_1d0 = (ParseContext *)pTVar2;
      local_1d8 = (TcParseTableBase *)hasbits_local;
      pFStack_1e0 = entry;
      local_1e1 = 0;
      bVar4 = EpsCopyInputStream::DataAvailable((EpsCopyInputStream *)pTVar2,(char *)pPVar1);
      x = local_1c0;
      p = local_1c8;
      pPVar1 = local_1d0;
      if (!bVar4) {
        TcFieldData::TcFieldData(&local_1f0);
        if (local_1d8->has_bits_offset != 0) {
          uVar7 = (uint)pFStack_1e0;
          puVar11 = RefAt<unsigned_int>(x,(ulong)(uint)local_1d8->has_bits_offset);
          *puVar11 = uVar7 | *puVar11;
        }
        return (char *)p;
      }
      TcFieldData::TcFieldData(&local_1f8);
      pTVar2 = local_1d8;
      pFVar3 = pFStack_1e0;
      uVar5 = UnalignedLoad<unsigned_short>((char *)p);
      uVar12 = (ulong)(int)((uint)uVar5 & (uint)pTVar2->fast_idx_mask);
      if ((uVar12 & 7) == 0) {
        data_1.field_0 =
             (anon_union_8_1_898a9ca8_for_TcFieldData_0)
             TcParseTableBase::fast_entry(pTVar2,uVar12 >> 3);
        local_1a8.data =
             ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)((long)data_1.field_0 + 8))->data ^
             (ulong)uVar5;
        UNRECOVERED_JUMPTABLE =
             TcParseTableBase::FastFieldEntry::target((FastFieldEntry *)data_1.field_0);
        local_1b0.data = local_1a8.data;
        pcVar8 = (*UNRECOVERED_JUMPTABLE)
                           (x,(char *)p,pPVar1,(TcFieldData)local_1a8,pTVar2,(uint64_t)pFVar3);
        return pcVar8;
      }
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
  }
  pcVar8 = ptr_local;
  pPVar1 = ctx_local;
  pTVar2 = table_local;
  TcFieldData::TcFieldData((TcFieldData *)local_308);
  pcVar8 = Error((MessageLite *)pcVar8,(char *)pPVar1,(ParseContext *)pTVar2,
                 (TcFieldData)local_308[0],(TcParseTableBase *)hasbits_local,(uint64_t)entry);
  return pcVar8;
}

Assistant:

const char* TcParser::MpRepeatedMessageOrGroup(PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  const uint16_t type_card = entry.type_card;
  ABSL_DCHECK_EQ(type_card & field_layout::kFcMask,
                 static_cast<uint16_t>(field_layout::kFcRepeated));
  const uint32_t decoded_tag = data.tag();
  const uint32_t decoded_wiretype = decoded_tag & 7;

  // Validate wiretype:
  if (!is_group) {
    ABSL_DCHECK_EQ(type_card & field_layout::kRepMask,
                   static_cast<uint16_t>(field_layout::kRepMessage));
    if (decoded_wiretype != WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
      PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
    }
  } else {
    ABSL_DCHECK_EQ(type_card & field_layout::kRepMask,
                   static_cast<uint16_t>(field_layout::kRepGroup));
    if (decoded_wiretype != WireFormatLite::WIRETYPE_START_GROUP) {
      PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
    }
  }

  void* const base = MaybeGetSplitBase(msg, is_split, table);
  RepeatedPtrFieldBase& field =
      MaybeCreateRepeatedRefAt<RepeatedPtrFieldBase, is_split>(
          base, entry.offset, msg);
  const TcParseTableBase* inner_table =
      GetTableFromAux(type_card, *table->field_aux(&entry));

  const char* ptr2 = ptr;
  uint32_t next_tag;
  do {
    MessageLite* value = AddMessage(inner_table, field);
    const auto inner_loop = [&](const char* ptr) {
      return ParseLoopPreserveNone(value, ptr, ctx, inner_table);
    };
    ptr = is_group ? ctx->ParseGroupInlined(ptr2, decoded_tag, inner_loop)
                   : ctx->ParseLengthDelimitedInlined(ptr2, inner_loop);
    if (ABSL_PREDICT_FALSE(ptr == nullptr)) goto error;
    if (ABSL_PREDICT_FALSE(!ctx->DataAvailable(ptr))) goto parse_loop;
    ptr2 = ReadTag(ptr, &next_tag);
    if (ABSL_PREDICT_FALSE(ptr2 == nullptr)) goto error;
  } while (next_tag == decoded_tag);
  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
parse_loop:
  PROTOBUF_MUSTTAIL return ToParseLoop(PROTOBUF_TC_PARAM_NO_DATA_PASS);
error:
  PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}